

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O1

If_Obj_t *
Lpk_MapTree_rec(Lpk_Man_t *p,Kit_DsdNtk_t *pNtk,If_Obj_t **ppLeaves,int iLit,If_Obj_t *pResult)

{
  ushort uVar1;
  uint uVar2;
  Kit_DsdObj_t KVar3;
  If_Obj_t *pIVar4;
  uint *puVar5;
  ulong uVar6;
  Kit_DsdObj_t *pKVar7;
  If_Obj_t *pFansNew [16];
  If_Obj_t *local_b8 [17];
  
  if (iLit < 0) {
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x74,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  uVar2 = (uint)iLit >> 1;
  uVar1 = pNtk->nVars;
  if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar2) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar2 < uVar1) {
    pKVar7 = (Kit_DsdObj_t *)0x0;
  }
  else {
    pKVar7 = pNtk->pNodes[(ulong)uVar2 - (ulong)uVar1];
  }
  if (pKVar7 == (Kit_DsdObj_t *)0x0) {
    return (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)ppLeaves[uVar2]);
  }
  KVar3 = *pKVar7;
  switch((uint)KVar3 >> 6 & 7) {
  case 1:
    return (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)p->pIfMan->pConst1);
  case 2:
    return (If_Obj_t *)
           ((ulong)((iLit ^ (uint)*(ushort *)(pKVar7 + 1)) & 1) ^
           *(ulong *)((long)ppLeaves + (ulong)(*(ushort *)(pKVar7 + 1) & 0xfffffffe) * 4));
  case 3:
    if (((uint)KVar3 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x88,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    local_b8[0] = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar7 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar7[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (local_b8[0] == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    local_b8[1] = pResult;
    pIVar4 = If_ManCreateAnd(p->pIfMan,local_b8[0],pResult);
    break;
  case 4:
    if (((uint)KVar3 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x93,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    local_b8[0] = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar7 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar7[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (local_b8[0] == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    uVar2 = (iLit ^ (uint)pResult ^ (uint)local_b8[0]) & 1;
    local_b8[1] = pResult;
    pIVar4 = If_ManCreateXor(p->pIfMan,(If_Obj_t *)((ulong)local_b8[0] & 0xfffffffffffffffe),
                             (If_Obj_t *)((ulong)pResult & 0xfffffffffffffffe));
    goto LAB_004b5b58;
  case 5:
    p->nBlocks[(uint)KVar3 >> 0x1a] = p->nBlocks[(uint)KVar3 >> 0x1a] + 1;
    KVar3 = *pKVar7;
    if ((uint)KVar3 < 0x4000000) {
      uVar2 = (uint)KVar3 >> 0x1a;
    }
    else {
      uVar6 = 0;
      do {
        pIVar4 = pResult;
        if (uVar6 != 0 || pResult == (If_Obj_t *)0x0) {
          pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,
                                   (uint)*(ushort *)((long)&pKVar7[1].field_0x0 + uVar6 * 2),
                                   (If_Obj_t *)0x0);
        }
        local_b8[uVar6] = pIVar4;
        if (pIVar4 == (If_Obj_t *)0x0) {
          return (If_Obj_t *)0x0;
        }
        uVar6 = uVar6 + 1;
        KVar3 = *pKVar7;
        uVar2 = (uint)KVar3 >> 0x1a;
      } while (uVar6 < uVar2);
    }
    if ((0 < p->pPars->nVarsShared) && (p->pPars->nLutSize < (int)uVar2)) {
      puVar5 = (uint *)0x0;
      if (((uint)KVar3 & 0x1c0) == 0x140) {
        puVar5 = (uint *)((long)&pKVar7[1].field_0x0 + (ulong)((uint)KVar3 >> 8 & 0x3fc));
      }
      pIVar4 = Lpk_MapSuppRedDec_rec(p,puVar5,uVar2,local_b8);
      if (pIVar4 != (If_Obj_t *)0x0) {
        return (If_Obj_t *)((ulong)pIVar4 ^ (ulong)(iLit & 1));
      }
    }
    KVar3 = *pKVar7;
    puVar5 = (uint *)0x0;
    if (((uint)KVar3 & 0x1c0) == 0x140) {
      puVar5 = (uint *)((long)&pKVar7[1].field_0x0 + (ulong)((uint)KVar3 >> 8 & 0x3fc));
    }
    pIVar4 = Lpk_MapPrime(p,puVar5,(uint)KVar3 >> 0x1a,local_b8);
    break;
  default:
    __assert_fail("pObj->Type == KIT_DSD_PRIME",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x9c,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  uVar2 = iLit & 1;
LAB_004b5b58:
  return (If_Obj_t *)((ulong)uVar2 ^ (ulong)pIVar4);
}

Assistant:

If_Obj_t * Lpk_MapTree_rec( Lpk_Man_t * p, Kit_DsdNtk_t * pNtk, If_Obj_t ** ppLeaves, int iLit, If_Obj_t * pResult )
{
    Kit_DsdObj_t * pObj;
    If_Obj_t * pObjNew = NULL, * pObjNew2 = NULL, * pFansNew[16];
    unsigned i, iLitFanin;

    assert( iLit >= 0 );

    // consider the case of a gate
    pObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(iLit)];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        return If_NotCond( If_ManConst1(p->pIfMan), Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_VAR )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(pObj->pFans[0])];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(pObj->pFans[0]) );
    }
    if ( pObj->Type == KIT_DSD_AND )
    {
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        pObjNew = If_ManCreateAnd( p->pIfMan, pFansNew[0], pFansNew[1] ); 
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        fCompl ^= If_IsComplement(pFansNew[0]) ^ If_IsComplement(pFansNew[1]);
        pObjNew = If_ManCreateXor( p->pIfMan, If_Regular(pFansNew[0]), If_Regular(pFansNew[1]) );
        return If_NotCond( pObjNew, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    p->nBlocks[pObj->nFans]++;

    // solve for the inputs
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        if ( i == 0 )
            pFansNew[i] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        else
            pFansNew[i] = Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        if ( pFansNew[i] == NULL )
            return NULL;
    }
/* 
    if ( !p->fCofactoring && p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew = Lpk_MapTreeMulti( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
*/
/*
    if ( (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapTreeMux_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
//        if ( pObjNew2 )
//            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }
*/

    // find best cofactoring variable
    if ( p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapSuppRedDec_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        if ( pObjNew2 )
            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }

    pObjNew = Lpk_MapPrime( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );

    // add choice
    if ( pObjNew && pObjNew2 )
    {
        If_ObjSetChoice( If_Regular(pObjNew), If_Regular(pObjNew2) );
        If_ManCreateChoice( p->pIfMan, If_Regular(pObjNew) );
    }
    return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
}